

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_17UL> *
kj::_::HeapArrayDisposer::allocate<kj::CappedArray<char,17ul>>(size_t count)

{
  CappedArray<char,_17UL> *pCVar1;
  
  pCVar1 = (CappedArray<char,_17UL> *)
           allocateImpl(0x20,count,count,Allocate_<kj::CappedArray<char,_17UL>_>::construct,
                        ArrayDisposer::Dispose_<kj::CappedArray<char,_17UL>_>::destruct);
  return pCVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}